

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verCore.c
# Opt level: O0

int Ver_ParseAssign(Ver_Man_t *pMan,Abc_Ntk_t *pNtk)

{
  Vec_Ptr_t *p_00;
  char cVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  void *pvVar5;
  char *pcVar6;
  size_t sVar7;
  Mio_Library_t *pMVar8;
  Hop_Obj_t *__s;
  Abc_Obj_t *pAVar9;
  int local_c4c;
  int local_c38;
  int local_c34;
  int local_c30;
  int local_c2c;
  int nLsb;
  int nMsb;
  int fReduction;
  int Length;
  int Limit;
  int Bit;
  int i;
  char Symbol;
  Hop_Obj_t *pFunc;
  char *pEquation;
  char *pName;
  char *pWord;
  Abc_Obj_t *pNet;
  Abc_Obj_t *pNode;
  Ver_Stream_t *p;
  char Buffer2 [2000];
  char Buffer [1000];
  Abc_Ntk_t *pNtk_local;
  Ver_Man_t *pMan_local;
  
  pNode = (Abc_Obj_t *)pMan->pReader;
  iVar2 = Ver_ParseConvertNetwork(pMan,pNtk,pMan->fMapped);
  if (iVar2 == 0) {
    pMan_local._4_4_ = 0;
  }
  else {
    do {
      do {
        pName = Ver_ParseGetName(pMan);
        if (pName == (char *)0x0) {
          return 0;
        }
        iVar2 = strcmp(pName,"#1");
      } while (iVar2 == 0);
      iVar2 = Ver_ParseLookupSuffix(pMan,pName,&local_c2c,&local_c30);
      if (iVar2 == 0) {
        return 0;
      }
      if (local_c30 < local_c2c) {
        local_c34 = local_c2c - local_c30;
      }
      else {
        local_c34 = local_c30 - local_c2c;
      }
      local_c34 = local_c34 + 1;
      fReduction = local_c34;
      if (((local_c2c < 0) || (local_c30 < 0)) || (local_c34 < 2)) {
        nLsb = 0;
        if ((*pName == '{') && (pMan->fNameLast == 0)) {
          nLsb = 1;
        }
        if (nLsb != 0) {
          pcVar6 = pName + 1;
          pName = pcVar6;
          sVar7 = strlen(pcVar6);
          pcVar6[sVar7 - 1] = '\0';
          if (*pName == '\\') {
            __assert_fail("pWord[0] != \'\\\\\'",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/ver/verCore.c"
                          ,0x4ad,"int Ver_ParseAssign(Ver_Man_t *, Abc_Ntk_t *)");
          }
        }
        pWord = (char *)Ver_ParseFindNet(pNtk,pName);
        if ((Abc_Obj_t *)pWord == (Abc_Obj_t *)0x0) {
          sprintf(pMan->sError,
                  "Cannot read the assign statement for %s (output wire is not defined).",pName);
          Ver_ParsePrintErrorMessage(pMan);
          return 0;
        }
        cVar1 = Ver_StreamPopChar((Ver_Stream_t *)pNode);
        if (cVar1 != '=') {
          sprintf(pMan->sError,"Cannot read the assign statement for %s (expected equality sign).",
                  pName);
          Ver_ParsePrintErrorMessage(pMan);
          return 0;
        }
        iVar2 = Ver_ParseSkipComments(pMan);
        if (iVar2 == 0) {
          return 0;
        }
        if (nLsb == 0) {
          pFunc = (Hop_Obj_t *)Ver_StreamGetWord((Ver_Stream_t *)pNode,",;");
        }
        else {
          pFunc = (Hop_Obj_t *)Ver_StreamGetWord((Ver_Stream_t *)pNode,";");
        }
        if (pFunc == (Hop_Obj_t *)0x0) {
          pcVar6 = Abc_ObjName((Abc_Obj_t *)pWord);
          sprintf(pMan->sError,"Cannot read the equation for %s.",pcVar6);
          Ver_ParsePrintErrorMessage(pMan);
          return 0;
        }
        Vec_PtrClear(pMan->vNames);
        if (pMan->fMapped == 0) {
          iVar2 = strcmp((char *)pFunc,"0");
          if (((iVar2 == 0) || (iVar2 = strcmp((char *)pFunc,"1\'b0"), iVar2 == 0)) ||
             (iVar2 = strcmp((char *)pFunc,"1\'bx"), iVar2 == 0)) {
            _i = (Mio_Gate_t *)Hop_ManConst0((Hop_Man_t *)pNtk->pManFunc);
          }
          else {
            iVar2 = strcmp((char *)pFunc,"1");
            if ((iVar2 == 0) || (iVar2 = strcmp((char *)pFunc,"1\'b1"), iVar2 == 0)) {
              _i = (Mio_Gate_t *)Hop_ManConst1((Hop_Man_t *)pNtk->pManFunc);
            }
            else if (nLsb == 0) {
              _i = (Mio_Gate_t *)
                   Ver_FormulaParser((char *)pFunc,pNtk->pManFunc,pMan->vNames,pMan->vStackFn,
                                     pMan->vStackOp,pMan->sError);
            }
            else {
              _i = (Mio_Gate_t *)
                   Ver_FormulaReduction((char *)pFunc,pNtk->pManFunc,pMan->vNames,pMan->sError);
            }
          }
          if (_i == (Mio_Gate_t *)0x0) {
            Ver_ParsePrintErrorMessage(pMan);
            return 0;
          }
        }
        else {
          iVar2 = strcmp((char *)pFunc,"1\'b0");
          if (iVar2 == 0) {
            pMVar8 = (Mio_Library_t *)Abc_FrameReadLibGen();
            _i = Mio_LibraryReadConst0(pMVar8);
          }
          else {
            iVar2 = strcmp((char *)pFunc,"1\'b1");
            if (iVar2 == 0) {
              pMVar8 = (Mio_Library_t *)Abc_FrameReadLibGen();
              _i = Mio_LibraryReadConst1(pMVar8);
            }
            else {
              if (*(char *)&pFunc->field_0 == '\\') {
                __s = (Hop_Obj_t *)((long)&pFunc->field_0 + 1);
                pFunc = __s;
                sVar7 = strlen((char *)__s);
                *(char *)((long)__s + (sVar7 - 1)) = '\0';
              }
              pAVar9 = Ver_ParseFindNet(pNtk,(char *)pFunc);
              if (pAVar9 == (Abc_Obj_t *)0x0) {
                sprintf(pMan->sError,
                        "Cannot read Verilog with non-trivial assignments in the mapped netlist.");
                Ver_ParsePrintErrorMessage(pMan);
                return 0;
              }
              p_00 = pMan->vNames;
              pvVar5 = (void *)strlen((char *)pFunc);
              Vec_PtrPush(p_00,pvVar5);
              Vec_PtrPush(pMan->vNames,pFunc);
              pMVar8 = (Mio_Library_t *)Abc_FrameReadLibGen();
              _i = Mio_LibraryReadBuf(pMVar8);
              if (_i == (Mio_Gate_t *)0x0) {
                pcVar6 = Abc_ObjName((Abc_Obj_t *)pWord);
                sprintf(pMan->sError,
                        "Reading assign statement for node %s has failed because the genlib library has no buffer."
                        ,pcVar6);
                Ver_ParsePrintErrorMessage(pMan);
                return 0;
              }
            }
          }
        }
        pNet = Abc_NtkCreateNode(pNtk);
        (pNet->field_5).pData = _i;
        Abc_ObjAddFanin((Abc_Obj_t *)pWord,pNet);
        for (Limit = 0; iVar2 = Limit, iVar4 = Vec_PtrSize(pMan->vNames), iVar2 < iVar4 / 2;
            Limit = Limit + 1) {
          pvVar5 = Vec_PtrEntry(pMan->vNames,Limit << 1);
          nMsb = (int)pvVar5;
          pEquation = (char *)Vec_PtrEntry(pMan->vNames,Limit * 2 + 1);
          pEquation[nMsb] = '\0';
          iVar2 = strcmp(pEquation,"1\'h0");
          if (iVar2 == 0) {
            pWord = (char *)Ver_ParseFindNet(pNtk,"1\'b0");
          }
          else {
            iVar2 = strcmp(pEquation,"1\'h1");
            if (iVar2 == 0) {
              pWord = (char *)Ver_ParseFindNet(pNtk,"1\'b1");
            }
            else {
              pWord = (char *)Ver_ParseFindNet(pNtk,pEquation);
            }
          }
          if (pWord == (char *)0x0) {
            sprintf(pMan->sError,
                    "Cannot read the assign statement for %s (input wire %s is not defined).",pName,
                    pEquation);
            Ver_ParsePrintErrorMessage(pMan);
            return 0;
          }
          Abc_ObjAddFanin(pNet,(Abc_Obj_t *)pWord);
        }
      }
      else {
        iVar2 = strcmp(pName,"1\'h0");
        if (iVar2 == 0) {
          strcpy(Buffer2 + 0x7c8,"1\'b0");
        }
        else {
          iVar2 = strcmp(pName,"1\'h1");
          if (iVar2 == 0) {
            strcpy(Buffer2 + 0x7c8,"1\'b1");
          }
          else {
            strcpy(Buffer2 + 0x7c8,pName);
          }
        }
        cVar1 = Ver_StreamPopChar((Ver_Stream_t *)pNode);
        if (cVar1 != '=') {
          sprintf(pMan->sError,"Cannot read the assign statement for %s (expected equality sign).",
                  pName);
          Ver_ParsePrintErrorMessage(pMan);
          return 0;
        }
        pName = Ver_ParseGetName(pMan);
        if (pName == (char *)0x0) {
          return 0;
        }
        if ((*pName < '0') || ('9' < *pName)) {
          sprintf(pMan->sError,"Currently can only assign vector-signal \"%s\" to be a constant.",
                  Buffer2 + 0x7c8);
          Ver_ParsePrintErrorMessage(pMan);
          return 0;
        }
        iVar2 = Ver_ParseConstant(pMan,pName);
        if (iVar2 == 0) {
          return 0;
        }
        if (local_c30 < local_c2c) {
          local_c38 = local_c2c - local_c30;
        }
        else {
          local_c38 = local_c30 - local_c2c;
        }
        local_c38 = local_c38 + 1;
        fReduction = local_c38;
        iVar2 = Vec_PtrSize(pMan->vNames);
        if (local_c38 != iVar2) {
          uVar3 = Vec_PtrSize(pMan->vNames);
          sprintf(pMan->sError,
                  "The constant size (%d) is different from the signal\"%s\" size (%d).",
                  (ulong)uVar3,Buffer2 + 0x7c8,(ulong)(uint)fReduction);
          Ver_ParsePrintErrorMessage(pMan);
          return 0;
        }
        Limit = 0;
        Length = local_c30;
        while (Limit < fReduction) {
          pvVar5 = Vec_PtrEntry(pMan->vNames,(fReduction + -1) - Limit);
          if (pvVar5 == (void *)0x0) {
            pWord = (char *)Ver_ParseFindNet(pNtk,"1\'b0");
          }
          else {
            pWord = (char *)Ver_ParseFindNet(pNtk,"1\'b1");
          }
          if (pWord == (char *)0x0) {
            __assert_fail("pNet != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/ver/verCore.c"
                          ,0x490,"int Ver_ParseAssign(Ver_Man_t *, Abc_Ntk_t *)");
          }
          pNet = Abc_NtkCreateNodeBuf(pNtk,(Abc_Obj_t *)pWord);
          sprintf((char *)&p,"%s[%d]",Buffer2 + 0x7c8,(ulong)(uint)Length);
          pWord = (char *)Ver_ParseFindNet(pNtk,(char *)&p);
          if ((Abc_Obj_t *)pWord == (Abc_Obj_t *)0x0) {
            sprintf(pMan->sError,
                    "Cannot read the assign statement for %s (output wire is not defined).",pName);
            Ver_ParsePrintErrorMessage(pMan);
            return 0;
          }
          Abc_ObjAddFanin((Abc_Obj_t *)pWord,pNet);
          Limit = Limit + 1;
          if (local_c30 < local_c2c) {
            local_c4c = Length + 1;
          }
          else {
            local_c4c = Length + -1;
          }
          Length = local_c4c;
        }
        Ver_ParseSkipComments(pMan);
      }
      Bit._3_1_ = Ver_StreamPopChar((Ver_Stream_t *)pNode);
    } while ((Bit._3_1_ == ',') || (Bit._3_1_ != ';'));
    pMan_local._4_4_ = 1;
  }
  return pMan_local._4_4_;
}

Assistant:

int Ver_ParseAssign( Ver_Man_t * pMan, Abc_Ntk_t * pNtk )
{
    char Buffer[1000], Buffer2[2000];
    Ver_Stream_t * p = pMan->pReader;
    Abc_Obj_t * pNode, * pNet;
    char * pWord, * pName, * pEquation;
    Hop_Obj_t * pFunc;
    char Symbol;
    int i, Bit, Limit, Length, fReduction;
    int nMsb, nLsb;

//    if ( Ver_StreamGetLineNumber(p) == 2756 )
//    {
//        int x = 0;
//    }

    // convert from the blackbox into the network with local functions representated by AIGs
    if ( !Ver_ParseConvertNetwork( pMan, pNtk, pMan->fMapped ) )
        return 0;

    while ( 1 )
    {
        // get the name of the output signal
        pWord = Ver_ParseGetName( pMan );
        if ( pWord == NULL )
            return 0;
        if ( strcmp(pWord, "#1") == 0 )
            continue;
        // check for vector-inputs
        if ( !Ver_ParseLookupSuffix( pMan, pWord, &nMsb, &nLsb ) )
            return 0;
        // handle special case of constant assignment
        Limit = nMsb > nLsb? nMsb - nLsb + 1: nLsb - nMsb + 1;
        if ( nMsb >= 0 && nLsb >= 0 && Limit > 1 )
        {
            // save the fanout name
            if ( !strcmp(pWord, "1\'h0") )
                strcpy( Buffer, "1\'b0" );
            else if ( !strcmp(pWord, "1\'h1") )
                strcpy( Buffer, "1\'b1" );
            else
                strcpy( Buffer, pWord );
            // get the equality sign
            if ( Ver_StreamPopChar(p) != '=' )
            {
                sprintf( pMan->sError, "Cannot read the assign statement for %s (expected equality sign).", pWord );
                Ver_ParsePrintErrorMessage( pMan );
                return 0;
            }
            // get the constant
            pWord = Ver_ParseGetName( pMan );
            if ( pWord == NULL )
                return 0;
            // check if it is indeed a constant
            if ( !(pWord[0] >= '0' && pWord[0] <= '9') )
            {
                sprintf( pMan->sError, "Currently can only assign vector-signal \"%s\" to be a constant.", Buffer );
                Ver_ParsePrintErrorMessage( pMan );
                return 0;
            }

            // get individual bits of the constant
            if ( !Ver_ParseConstant( pMan, pWord ) )
                return 0;
            // check that the constant has the same size
            Limit = nMsb > nLsb? nMsb - nLsb + 1: nLsb - nMsb + 1;
            if ( Limit != Vec_PtrSize(pMan->vNames) )
            {
                sprintf( pMan->sError, "The constant size (%d) is different from the signal\"%s\" size (%d).", 
                    Vec_PtrSize(pMan->vNames), Buffer, Limit );
                Ver_ParsePrintErrorMessage( pMan );
                return 0;
            }
            // iterate through the bits
            for ( i = 0, Bit = nLsb; i < Limit; i++, Bit = nMsb > nLsb ? Bit + 1: Bit - 1  )
            {
                // get the fanin net
                if ( Vec_PtrEntry( pMan->vNames, Limit-1-i ) )
                    pNet = Ver_ParseFindNet( pNtk, "1\'b1" );
                else
                    pNet = Ver_ParseFindNet( pNtk, "1\'b0" );
                assert( pNet != NULL );

                // create the buffer
                pNode = Abc_NtkCreateNodeBuf( pNtk, pNet );

                // get the fanout net
                sprintf( Buffer2, "%s[%d]", Buffer, Bit );
                pNet = Ver_ParseFindNet( pNtk, Buffer2 );
                if ( pNet == NULL )
                {
                    sprintf( pMan->sError, "Cannot read the assign statement for %s (output wire is not defined).", pWord );
                    Ver_ParsePrintErrorMessage( pMan );
                    return 0;
                }
                Abc_ObjAddFanin( pNet, pNode );
            }
            // go to the end of the line
            Ver_ParseSkipComments( pMan );
        }
        else
        {
            // consider the case of reduction operations
            fReduction = 0;
            if ( pWord[0] == '{' && !pMan->fNameLast )
                fReduction = 1;
            if ( fReduction )
            {
                pWord++;
                pWord[strlen(pWord)-1] = 0;
                assert( pWord[0] != '\\' );
            }
            // get the fanout net
            pNet = Ver_ParseFindNet( pNtk, pWord );
            if ( pNet == NULL )
            {
                sprintf( pMan->sError, "Cannot read the assign statement for %s (output wire is not defined).", pWord );
                Ver_ParsePrintErrorMessage( pMan );
                return 0;
            }
            // get the equality sign
            if ( Ver_StreamPopChar(p) != '=' )
            {
                sprintf( pMan->sError, "Cannot read the assign statement for %s (expected equality sign).", pWord );
                Ver_ParsePrintErrorMessage( pMan );
                return 0;
            }
            // skip the comments
            if ( !Ver_ParseSkipComments( pMan ) )
                return 0;
            // get the second name
            if ( fReduction )
                pEquation = Ver_StreamGetWord( p, ";" );
            else
                pEquation = Ver_StreamGetWord( p, ",;" );
            if ( pEquation == NULL )
            {
                sprintf( pMan->sError, "Cannot read the equation for %s.", Abc_ObjName(pNet) );
                Ver_ParsePrintErrorMessage( pMan );
                return 0;
            }

            // consider the case of mapped network
            Vec_PtrClear( pMan->vNames );
            if ( pMan->fMapped )
            {
                if ( !strcmp( pEquation, "1\'b0" ) )
                    pFunc = (Hop_Obj_t *)Mio_LibraryReadConst0((Mio_Library_t *)Abc_FrameReadLibGen());
                else if ( !strcmp( pEquation, "1\'b1" ) )
                    pFunc = (Hop_Obj_t *)Mio_LibraryReadConst1((Mio_Library_t *)Abc_FrameReadLibGen());
                else
                {
                    // "assign foo = \bar ;"
                    if ( *pEquation == '\\' )
                    {
                        pEquation++;
                        pEquation[strlen(pEquation) - 1] = 0;
                    }
                    if ( Ver_ParseFindNet(pNtk, pEquation) == NULL )
                    {
                        sprintf( pMan->sError, "Cannot read Verilog with non-trivial assignments in the mapped netlist." );
                        Ver_ParsePrintErrorMessage( pMan );
                        return 0;
                    }
                    Vec_PtrPush( pMan->vNames, (void *)(ABC_PTRUINT_T)strlen(pEquation) );
                    Vec_PtrPush( pMan->vNames, pEquation );
                    // get the buffer
                    pFunc = (Hop_Obj_t *)Mio_LibraryReadBuf((Mio_Library_t *)Abc_FrameReadLibGen());
                    if ( pFunc == NULL )
                    {
                        sprintf( pMan->sError, "Reading assign statement for node %s has failed because the genlib library has no buffer.", Abc_ObjName(pNet) );
                        Ver_ParsePrintErrorMessage( pMan );
                        return 0;
                    }
                }
            }
            else
            {
                if ( !strcmp(pEquation, "0") || !strcmp(pEquation, "1\'b0") || !strcmp(pEquation, "1\'bx") )
                    pFunc = Hop_ManConst0((Hop_Man_t *)pNtk->pManFunc);
                else if ( !strcmp(pEquation, "1") || !strcmp(pEquation, "1\'b1") )
                    pFunc = Hop_ManConst1((Hop_Man_t *)pNtk->pManFunc);
                else if ( fReduction )
                    pFunc = (Hop_Obj_t *)Ver_FormulaReduction( pEquation, pNtk->pManFunc, pMan->vNames, pMan->sError );  
                else
                    pFunc = (Hop_Obj_t *)Ver_FormulaParser( pEquation, pNtk->pManFunc, pMan->vNames, pMan->vStackFn, pMan->vStackOp, pMan->sError );  
                if ( pFunc == NULL )
                {
                    Ver_ParsePrintErrorMessage( pMan );
                    return 0;
                }
            }

            // create the node with the given inputs
            pNode = Abc_NtkCreateNode( pNtk );
            pNode->pData = pFunc;
            Abc_ObjAddFanin( pNet, pNode );
            // connect to fanin nets
            for ( i = 0; i < Vec_PtrSize(pMan->vNames)/2; i++ )
            {
                // get the name of this signal
                Length = (int)(ABC_PTRUINT_T)Vec_PtrEntry( pMan->vNames, 2*i );
                pName  = (char *)Vec_PtrEntry( pMan->vNames, 2*i + 1 );
                pName[Length] = 0;
                // try name
//                pNet = Ver_ParseFindNet( pNtk, pName );
                if ( !strcmp(pName, "1\'h0") )
                    pNet = Ver_ParseFindNet( pNtk, "1\'b0" );
                else if ( !strcmp(pName, "1\'h1") )
                    pNet = Ver_ParseFindNet( pNtk, "1\'b1" );
                else
                    pNet = Ver_ParseFindNet( pNtk, pName );
                // find the corresponding net
                if ( pNet == NULL )
                {
                    sprintf( pMan->sError, "Cannot read the assign statement for %s (input wire %s is not defined).", pWord, pName );
                    Ver_ParsePrintErrorMessage( pMan );
                    return 0;
                }
                Abc_ObjAddFanin( pNode, pNet );
            }
        }

        Symbol = Ver_StreamPopChar(p);
        if ( Symbol == ',' )
            continue;
        if ( Symbol == ';' )
            return 1;
    }
    return 1;
}